

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
argstest::ValueFlag<int,_argstest::ValueReader>::ParseValue
          (ValueFlag<int,_argstest::ValueReader> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values_)

{
  type_conflict2 tVar1;
  const_reference value;
  string *value_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values__local;
  ValueFlag<int,_argstest::ValueReader> *this_local;
  
  value = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(values_,0);
  tVar1 = ValueReader::operator()
                    ((ValueReader *)&this->field_0x140,
                     &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,value,
                     &this->value);
  if (!tVar1) {
    (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.error = Parse;
  }
  return;
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value_ = values_.at(0);

#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }